

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void __thiscall Liby::http::HttpClient::destroy(HttpClient *this)

{
  HttpClient *this_local;
  
  std::__cxx11::
  list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ::clear(&this->requestLists_);
  std::__shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->http_client_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void Liby::http::HttpClient::destroy() {
    requestLists_.clear();
    http_client_.reset();
    http_conn_.reset();
}